

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

LargeHeapBlock *
Memory::LargeHeapBlock::New
          (char *address,size_t pageCount,Segment *segment,uint objectCount,LargeHeapBucket *bucket)

{
  bool bVar1;
  HeapAllocator *pHVar2;
  LargeHeapBlock *this;
  size_t byteSize;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._32_8_ = bucket;
  pHVar2 = HeapAllocator::GetNoMemProtectInstance();
  bVar1 = Recycler::DoProfileAllocTracker();
  data.typeinfo = (type_info *)((ulong)objectCount << bVar1 + 3);
  local_68 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2746cbf;
  data.filename._0_4_ = 0xa6;
  pHVar2 = HeapAllocator::TrackAllocInfo(pHVar2,(TrackAllocData *)local_68);
  bVar1 = Recycler::DoProfileAllocTracker();
  byteSize = ((ulong)objectCount << bVar1 + 3) + 0xb8;
  this = (LargeHeapBlock *)HeapAllocator::AllocT<true>(pHVar2,byteSize);
  if (this != (LargeHeapBlock *)0x0) {
    memset(this,0,byteSize);
  }
  LargeHeapBlock(this,address,pageCount,segment,objectCount,(LargeHeapBucket *)data._32_8_);
  return this;
}

Assistant:

LargeHeapBlock *
LargeHeapBlock::New(__in char * address, DECLSPEC_GUARD_OVERFLOW size_t pageCount, Segment * segment, DECLSPEC_GUARD_OVERFLOW uint objectCount, LargeHeapBucket* bucket)
{
    return NoMemProtectHeapNewNoThrowPlusZ(GetAllocPlusSize(objectCount), LargeHeapBlock, address, pageCount, segment, objectCount, bucket);
}